

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::UpdateImpl(cmCTestBZR *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *command;
  pointer pbVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> bzr_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  OutputLogger out;
  UpdateParser err;
  char **local_1c8;
  iterator iStack_1c0;
  char **local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  string local_198;
  undefined1 local_178 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined1 local_138 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [13];
  char *local_38;
  
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  pcVar1 = local_138 + 0x10;
  local_138._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_198,pcVar2,(string *)local_138);
  command = extraout_RDX;
  if ((pointer)local_138._0_8_ != pcVar1) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    command = extraout_RDX_00;
  }
  if (local_198._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"BZRUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_138,pcVar2,(string *)local_178);
    std::__cxx11::string::operator=((string *)&local_198,(string *)local_138);
    command = extraout_RDX_01;
    if ((pointer)local_138._0_8_ != pcVar1) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      command = extraout_RDX_02;
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      command = extraout_RDX_03;
    }
  }
  cmSystemTools::ParseArguments_abi_cxx11_
            (&local_1b0,(cmSystemTools *)local_198._M_dataplus._M_p,command);
  local_1c8 = (char **)0x0;
  iStack_1c0._M_current = (char **)0x0;
  local_1b8 = (char **)0x0;
  local_138._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(iterator)0x0,
             (char **)local_138);
  local_138._0_8_ = "pull";
  if (iStack_1c0._M_current == local_1b8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,iStack_1c0,
               (char **)local_138);
  }
  else {
    *iStack_1c0._M_current = "pull";
    iStack_1c0._M_current = iStack_1c0._M_current + 1;
  }
  if (local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_138._0_8_ = (pbVar4->_M_dataplus)._M_p;
      if (iStack_1c0._M_current == local_1b8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,iStack_1c0,
                   (char **)local_138);
      }
      else {
        *iStack_1c0._M_current = (char *)local_138._0_8_;
        iStack_1c0._M_current = iStack_1c0._M_current + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_1b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_138._0_8_ = (this->URL)._M_dataplus._M_p;
  if (iStack_1c0._M_current == local_1b8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,iStack_1c0,
               (char **)local_138);
  }
  else {
    *iStack_1c0._M_current = (char *)local_138._0_8_;
    iStack_1c0._M_current = iStack_1c0._M_current + 1;
  }
  local_138._0_8_ = (pointer)0x0;
  if (iStack_1c0._M_current == local_1b8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,iStack_1c0,
               (char **)local_138);
  }
  else {
    *iStack_1c0._M_current = (char *)0x0;
    iStack_1c0._M_current = iStack_1c0._M_current + 1;
  }
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_178,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "pull-out> ");
  UpdateParser::UpdateParser((UpdateParser *)local_138,this,"pull-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_1c8,(OutputParser *)local_178,(OutputParser *)local_138
                    );
  local_138._0_8_ = &PTR__UpdateParser_006b6cb8;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  local_138._0_8_ = &PTR__LineParser_006b87c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._24_8_ != local_110) {
    operator_delete((void *)local_138._24_8_,local_110[0]._M_allocated_capacity + 1);
  }
  local_178._0_8_ = &PTR__LineParser_006b87c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._24_8_ != &local_150) {
    operator_delete((void *)local_178._24_8_,local_150._M_allocated_capacity + 1);
  }
  if (local_1c8 != (char **)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestBZR::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if(opts.empty())
    {
    opts = this->CTest->GetCTestConfiguration("BZRUpdateOptions");
    }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  // Use "bzr pull" to update the working tree.
  std::vector<char const*> bzr_update;
  bzr_update.push_back(this->CommandLineTool.c_str());
  bzr_update.push_back("pull");

  for(std::vector<std::string>::const_iterator ai = args.begin();
      ai != args.end(); ++ai)
    {
    bzr_update.push_back(ai->c_str());
    }

  bzr_update.push_back(this->URL.c_str());

  bzr_update.push_back(0);

  // For some reason bzr uses stderr to display the update status.
  OutputLogger out(this->Log, "pull-out> ");
  UpdateParser err(this, "pull-err> ");
  return this->RunUpdateCommand(&bzr_update[0], &out, &err);
}